

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleFilter.cpp
# Opt level: O1

void __thiscall
Ptex::v2_4::PtexTriangleFilter::applyAcrossEdge
          (PtexTriangleFilter *this,PtexTriangleKernel *k,FaceInfo *f,int eid)

{
  byte bVar1;
  uint faceid;
  int iVar2;
  undefined4 extraout_var;
  
  bVar1 = f->adjedges;
  faceid = f->adjfaces[eid];
  iVar2 = (*this->_tx->_vptr_PtexTexture[0x10])(this->_tx,(ulong)faceid);
  PtexTriangleKernel::reorient(k,eid,bVar1 >> ((char)eid * '\x02' & 0x1fU) & 3);
  splitAndApply(this,k,faceid,(FaceInfo *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

void PtexTriangleFilter::applyAcrossEdge(PtexTriangleKernel& k,
                                         const Ptex::FaceInfo& f, int eid)
{
    int afid = f.adjface(eid), aeid = f.adjedge(eid);
    const Ptex::FaceInfo& af = _tx->getFaceInfo(afid);
    k.reorient(eid, aeid);
    splitAndApply(k, afid, af);
}